

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O2

int vm_add_num(VM *vm,double num)

{
  int iVar1;
  uint uVar2;
  Value *__ptr;
  ulong uVar3;
  ulong uVar4;
  
  uVar2 = vm->consts_count;
  uVar3 = 0;
  uVar4 = 0;
  if (0 < (int)uVar2) {
    uVar4 = (ulong)uVar2;
  }
  while( true ) {
    if (uVar4 == uVar3) {
      iVar1 = vm->consts_capacity;
      __ptr = vm->consts;
      if (iVar1 <= (int)uVar2) {
        vm->consts_capacity = iVar1 * 2;
        __ptr = (Value *)realloc(__ptr,(long)iVar1 << 4);
        vm->consts = __ptr;
        uVar2 = vm->consts_count;
      }
      vm->consts_count = uVar2 + 1;
      __ptr[(int)uVar2] = (Value)num;
      return uVar2;
    }
    if ((double)vm->consts[uVar3] == num) break;
    uVar3 = uVar3 + 1;
  }
  return (int)uVar3;
}

Assistant:

int vm_add_num(VM *vm, double num) {
	uint64_t converted = n2v(num);

	// Check if the constant already exists
	for (int i = 0; i < vm->consts_count; i++) {
		if (vm->consts[i] == converted) {
			return i;
		}
	}

	// Resize the constants array if necessary
	if (vm->consts_count >= vm->consts_capacity) {
		vm->consts_capacity *= 2;
		vm->consts = realloc(vm->consts, sizeof(Value) * vm->consts_capacity);
	}

	// Add the converted number to the constants list if it doesn't already
	// exist
	vm->consts[vm->consts_count++] = converted;
	return vm->consts_count - 1;
}